

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::MethodDescriptor::DebugStringWithOptions_abi_cxx11_
          (MethodDescriptor *this,DebugStringOptions *options)

{
  string *in_RDI;
  string *contents;
  DebugStringOptions *in_stack_00000518;
  string *in_stack_00000520;
  int in_stack_0000052c;
  MethodDescriptor *in_stack_00000530;
  
  std::__cxx11::string::string((string *)in_RDI);
  DebugString(in_stack_00000530,in_stack_0000052c,in_stack_00000520,in_stack_00000518);
  return in_RDI;
}

Assistant:

std::string MethodDescriptor::DebugStringWithOptions(
    const DebugStringOptions& options) const {
  std::string contents;
  DebugString(0, &contents, options);
  return contents;
}